

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaHash.c
# Opt level: O2

int Pla_ManHashDistance1(Pla_Man_t *p)

{
  Tab_Obj_t *pTVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int Lit;
  int iVar5;
  int iVar6;
  Vec_Int_t *p_00;
  Tab_Man_t *pTab;
  Vec_Int_t *pVVar7;
  long lVar8;
  int i_00;
  Tab_Obj_t *pTVar9;
  int i;
  int iVar10;
  uint uVar11;
  uint local_58;
  
  p_00 = Vec_IntAlloc(p->nIns);
  iVar2 = Abc_Base2Log((p->vCubes).nSize);
  if (0x18 < iVar2) {
    __assert_fail("nBits <= 26",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaHash.c"
                  ,0xb9,"int Pla_ManHashDistance1(Pla_Man_t *)");
  }
  pTab = Tab_ManAlloc(iVar2 + 2,p);
  Pla_ManConvertFromBits(p);
  Pla_ManHashCubes(p,pTab);
  iVar2 = 0;
  local_58 = 0;
  do {
    if ((p->vCubeLits).nSize <= iVar2) {
      Vec_IntFree(p_00);
      Tab_ManFree(pTab);
      if ((local_58 & 1) != 0) {
        __assert_fail("!(Count & 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaHash.c"
                      ,0xd1,"int Pla_ManHashDistance1(Pla_Man_t *)");
      }
      return (int)local_58 >> 1;
    }
    pVVar7 = Vec_WecEntry(&p->vCubeLits,iVar2);
    p_00->nSize = 0;
    for (iVar10 = 0; iVar10 < pVVar7->nSize; iVar10 = iVar10 + 1) {
      iVar3 = Vec_IntEntry(pVVar7,iVar10);
      Vec_IntPush(p_00,iVar3);
    }
    iVar4 = Vec_IntEntry(&p->vHashes,iVar2);
    i_00 = 0;
    iVar10 = iVar4;
    iVar3 = p_00->nSize;
    if (p_00->nSize < 1) {
      iVar3 = i_00;
    }
    for (; i_00 != iVar3; i_00 = i_00 + 1) {
      Lit = Vec_IntEntry(p_00,i_00);
      iVar5 = Abc_LitNot(Lit);
      iVar5 = Pla_HashValue(iVar5);
      iVar6 = Pla_HashValue(Lit);
      uVar11 = (iVar5 - iVar6) + iVar10;
      iVar10 = Abc_LitNot(Lit);
      Vec_IntWriteEntry(p_00,i_00,iVar10);
      pTVar1 = pTab->pBins;
      pTVar9 = pTVar1 + (int)(pTab->SizeMask & uVar11);
      do {
        lVar8 = (long)pTVar9->Table;
        iVar10 = 0;
        if ((lVar8 == 0) || (pTVar1 == (Tab_Obj_t *)0x0)) goto LAB_002f2ea0;
        pTVar9 = (Tab_Obj_t *)&pTVar1[lVar8].Next;
        pVVar7 = Vec_WecEntry(&pTab->pMan->vCubeLits,pTVar1[lVar8].Cube);
        iVar10 = Vec_IntEqual(pVVar7,p_00);
      } while (iVar10 == 0);
      iVar10 = 1;
LAB_002f2ea0:
      local_58 = local_58 + iVar10;
      iVar10 = Abc_LitNot(Lit);
      iVar10 = Pla_HashValue(iVar10);
      iVar5 = Pla_HashValue(Lit);
      Vec_IntWriteEntry(p_00,i_00,Lit);
      iVar10 = (uVar11 - iVar10) + iVar5;
    }
    iVar2 = iVar2 + 1;
    if (iVar10 != iVar4) {
      __assert_fail("Value == ValueCopy",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaHash.c"
                    ,0xcd,"int Pla_ManHashDistance1(Pla_Man_t *)");
    }
  } while( true );
}

Assistant:

int Pla_ManHashDistance1( Pla_Man_t * p )
{
    Tab_Man_t * pTab;
    Vec_Int_t * vCube;
    Vec_Int_t * vCubeCopy = Vec_IntAlloc( p->nIns );
    int nBits = Abc_Base2Log( Pla_ManCubeNum(p) ) + 2;
    int i, k, Lit, Value, ValueCopy, Count = 0;
    assert( nBits <= 26 );
    pTab = Tab_ManAlloc( nBits, p );
    Pla_ManConvertFromBits( p );
    Pla_ManHashCubes( p, pTab );
    Vec_WecForEachLevel( &p->vCubeLits, vCube, i )
    {
        Vec_IntClear( vCubeCopy );
        Vec_IntAppend( vCubeCopy, vCube );
        Value = ValueCopy = Vec_IntEntry( &p->vHashes, i );
        Vec_IntForEachEntry( vCubeCopy, Lit, k )
        {
            // create new
            Value += Pla_HashValue(Abc_LitNot(Lit)) - Pla_HashValue(Lit);
            Vec_IntWriteEntry( vCubeCopy, k, Abc_LitNot(Lit) );
            // check the cube
            Count += Tab_ManHashLookup( pTab, Value, vCubeCopy );
            // create old
            Value -= Pla_HashValue(Abc_LitNot(Lit)) - Pla_HashValue(Lit);
            Vec_IntWriteEntry( vCubeCopy, k, Lit );
        }
        assert( Value == ValueCopy );
    }
    Vec_IntFree( vCubeCopy );
    Tab_ManFree( pTab );
    assert( !(Count & 1) );
    return Count/2;
}